

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O1

MOJOSHADER_astDataType *
new_datatype_vector(Context_conflict *ctx,MOJOSHADER_astDataType *dt,int columns)

{
  int iVar1;
  MOJOSHADER_astDataType *retval;
  MOJOSHADER_astDataType *local_20;
  
  local_20 = (MOJOSHADER_astDataType *)(*ctx->malloc)(0x20,ctx->malloc_data);
  if (local_20 == (MOJOSHADER_astDataType *)0x0) {
    ctx->isfail = 1;
    ctx->out_of_memory = 1;
  }
  else {
    iVar1 = buffer_append(ctx->garbage,&local_20,8);
    if (iVar1 != 0) {
      if (columns - 5U < 0xfffffffc) {
        failf(ctx,"%s","Vector must have between 1 and 4 elements");
      }
      local_20->type = MOJOSHADER_AST_DATATYPE_VECTOR;
      (local_20->array).base = dt;
      (local_20->array).elements = columns;
      return local_20;
    }
    (*ctx->free)(local_20,ctx->malloc_data);
  }
  return (MOJOSHADER_astDataType *)0x0;
}

Assistant:

static const MOJOSHADER_astDataType *new_datatype_vector(Context *ctx,
                                            const MOJOSHADER_astDataType *dt,
                                            const int columns)
{
    MOJOSHADER_astDataType *retval;
    retval = (MOJOSHADER_astDataType *) Malloc(ctx, sizeof (*retval));
    if (retval == NULL)
        return NULL;

    // !!! FIXME: this is hacky.
    // !!! FIXME:  I'd like to cache these anyhow and reuse types.
    if (!buffer_append(ctx->garbage, &retval, sizeof (retval)))
    {
        Free(ctx, retval);
        return NULL;
    } // if

    if ((columns < 1) || (columns > 4))
        fail(ctx, "Vector must have between 1 and 4 elements");

    retval->type = MOJOSHADER_AST_DATATYPE_VECTOR;
    retval->vector.base = dt;
    retval->vector.elements = columns;
    return retval;
}